

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O0

void __thiscall HawkTracer::parser::KlassRegister::KlassRegister(KlassRegister *this)

{
  pointer pEVar1;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  local_140;
  FieldTypeId local_134;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_130;
  FieldTypeId local_124;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_120;
  FieldTypeId local_114;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_110;
  FieldTypeId local_104;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_100;
  FieldTypeId local_f4;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_f0;
  type local_e4;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  local_e0;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  klass_field_info_event;
  FieldTypeId local_cc;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_c8;
  FieldTypeId local_bc;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_b8;
  FieldTypeId local_ac;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_a8;
  type local_9c;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  local_98;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  klass_info_event;
  FieldTypeId local_84;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_80;
  type local_74;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  local_70;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  endianness_event;
  FieldTypeId local_5c;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_58;
  FieldTypeId local_4c;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_48;
  FieldTypeId local_3c;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_38 [3];
  type local_1c;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  local_18;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  base_event;
  KlassRegister *this_local;
  
  base_event._M_t.
  super___uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  ._M_t.
  super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
  .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl =
       (__uniq_ptr_data<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>,_true,_true>
        )(__uniq_ptr_data<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>,_true,_true>
          )this;
  std::mutex::mutex(&this->_register_mtx);
  std::
  unordered_map<unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>_>
  ::unordered_map(&this->_register);
  local_1c = to_underlying<HawkTracer::parser::WellKnownKlasses>(EventKlass);
  make_unique<HawkTracer::parser::EventKlass,char_const(&)[9],unsigned_int>
            ((parser *)&local_18,(char (*) [9])"HT_Event",&local_1c);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_18);
  local_3c = UINT32;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[9],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)local_38,(char (*) [9])0x1424b9,(char (*) [9])"uint32_t",&local_3c);
  EventKlass::add_field(pEVar1,local_38);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(local_38);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_18);
  local_4c = UINT64;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[10],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_48,(char (*) [10])"timestamp",(char (*) [9])"uint64_t",&local_4c);
  EventKlass::add_field(pEVar1,&local_48);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_48);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_18);
  local_5c = UINT64;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[3],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_58,(char (*) [3])0x1424bf,(char (*) [9])"uint64_t",&local_5c);
  EventKlass::add_field(pEVar1,&local_58);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_58);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  unique_ptr(&endianness_event,&local_18);
  _add_klass(this,&endianness_event);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr(&endianness_event);
  local_74 = to_underlying<HawkTracer::parser::WellKnownKlasses>(EndiannessInfoEventKlass);
  make_unique<HawkTracer::parser::EventKlass,char_const(&)[23],unsigned_int>
            ((parser *)&local_70,(char (*) [23])"HT_EndiannessInfoEvent",&local_74);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_70);
  local_84 = UINT8;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[11],char_const(&)[8],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_80,(char (*) [11])"endianness",(char (*) [8])"uint8_t",&local_84);
  EventKlass::add_field(pEVar1,&local_80);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_80);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  unique_ptr(&klass_info_event,&local_70);
  _add_klass(this,&klass_info_event);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr(&klass_info_event);
  local_9c = to_underlying<HawkTracer::parser::WellKnownKlasses>(EventKlassInfoEventKlass);
  make_unique<HawkTracer::parser::EventKlass,char_const(&)[23],unsigned_int>
            ((parser *)&local_98,(char (*) [23])"HT_EventKlassInfoEvent",&local_9c);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_98);
  local_ac = UINT32;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[14],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_a8,(char (*) [14])"info_klass_id",(char (*) [9])"uint32_t",&local_ac);
  EventKlass::add_field(pEVar1,&local_a8);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_a8);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_98);
  local_bc = STRING;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[17],char_const(&)[12],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_b8,(char (*) [17])"event_klass_name",(char (*) [12])"const char*",
             &local_bc);
  EventKlass::add_field(pEVar1,&local_b8);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_b8);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_98);
  local_cc = UINT8;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[12],char_const(&)[8],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_c8,(char (*) [12])"field_count",(char (*) [8])"uint8_t",&local_cc);
  EventKlass::add_field(pEVar1,&local_c8);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_c8);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  unique_ptr(&klass_field_info_event,&local_98);
  _add_klass(this,&klass_field_info_event);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr(&klass_field_info_event);
  local_e4 = to_underlying<HawkTracer::parser::WellKnownKlasses>(EventKlassFieldInfoEventKlass);
  make_unique<HawkTracer::parser::EventKlass,char_const(&)[28],unsigned_int>
            ((parser *)&local_e0,(char (*) [28])"HT_EventKlassFieldInfoEvent",&local_e4);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_e0);
  local_f4 = UINT32;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[14],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_f0,(char (*) [14])"info_klass_id",(char (*) [9])"uint32_t",&local_f4);
  EventKlass::add_field(pEVar1,&local_f0);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_f0);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_e0);
  local_104 = STRING;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[11],char_const(&)[12],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_100,(char (*) [11])"field_type",(char (*) [12])"const char*",
             &local_104);
  EventKlass::add_field(pEVar1,&local_100);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_100);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_e0);
  local_114 = STRING;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[11],char_const(&)[12],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_110,(char (*) [11])"field_name",(char (*) [12])"const char*",
             &local_114);
  EventKlass::add_field(pEVar1,&local_110);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_110);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_e0);
  local_124 = UINT64;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[5],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_120,(char (*) [5])"size",(char (*) [9])"uint64_t",&local_124);
  EventKlass::add_field(pEVar1,&local_120);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_120);
  pEVar1 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(&local_e0);
  local_134 = UINT8;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[10],char_const(&)[8],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_130,(char (*) [10])"data_type",(char (*) [8])"uint8_t",&local_134);
  EventKlass::add_field(pEVar1,&local_130);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_130);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  unique_ptr(&local_140,&local_e0);
  _add_klass(this,&local_140);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr(&local_140);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr(&local_e0);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr(&local_98);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr(&local_70);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr(&local_18);
  return;
}

Assistant:

KlassRegister::KlassRegister()
{
    auto base_event = make_unique<EventKlass>("HT_Event", to_underlying(WellKnownKlasses::EventKlass));
    base_event->add_field(make_unique<EventKlassField>("klass_id", "uint32_t", FieldTypeId::UINT32));
    base_event->add_field(make_unique<EventKlassField>("timestamp", "uint64_t", FieldTypeId::UINT64));
    base_event->add_field(make_unique<EventKlassField>("id", "uint64_t", FieldTypeId::UINT64));
    _add_klass(std::move(base_event));

    auto endianness_event = make_unique<EventKlass>("HT_EndiannessInfoEvent", to_underlying(WellKnownKlasses::EndiannessInfoEventKlass));
    endianness_event->add_field(make_unique<EventKlassField>("endianness", "uint8_t", FieldTypeId::UINT8));
    _add_klass(std::move(endianness_event));

    auto klass_info_event = make_unique<EventKlass>("HT_EventKlassInfoEvent", to_underlying(WellKnownKlasses::EventKlassInfoEventKlass));
    klass_info_event->add_field(make_unique<EventKlassField>("info_klass_id", "uint32_t", FieldTypeId::UINT32));
    klass_info_event->add_field(make_unique<EventKlassField>("event_klass_name", "const char*", FieldTypeId::STRING));
    klass_info_event->add_field(make_unique<EventKlassField>("field_count", "uint8_t", FieldTypeId::UINT8));
    _add_klass(std::move(klass_info_event));

    auto klass_field_info_event = make_unique<EventKlass>("HT_EventKlassFieldInfoEvent", to_underlying(WellKnownKlasses::EventKlassFieldInfoEventKlass));
    klass_field_info_event->add_field(make_unique<EventKlassField>("info_klass_id", "uint32_t", FieldTypeId::UINT32));
    klass_field_info_event->add_field(make_unique<EventKlassField>("field_type", "const char*", FieldTypeId::STRING));
    klass_field_info_event->add_field(make_unique<EventKlassField>("field_name", "const char*", FieldTypeId::STRING));
    klass_field_info_event->add_field(make_unique<EventKlassField>("size", "uint64_t", FieldTypeId::UINT64));
    klass_field_info_event->add_field(make_unique<EventKlassField>("data_type", "uint8_t", FieldTypeId::UINT8));
    _add_klass(std::move(klass_field_info_event));
}